

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

int sam_hdr_add_lines(SAM_hdr *sh,char *lines,int len)

{
  char cVar1;
  size_t sVar2;
  SAM_hdr_type **ppSVar3;
  SAM_hdr_item_s *pSVar4;
  char cVar5;
  khint_t kVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  size_t __n;
  ulong uVar10;
  size_t sVar11;
  char *pcVar12;
  SAM_hdr_type *h_type;
  SAM_hdr_type *pSVar13;
  SAM_hdr_tag *pSVar14;
  SAM_hdr_tag *pSVar15;
  char *pcVar16;
  char *pcVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  char *pcVar22;
  size_t __size;
  uint key;
  int iVar23;
  int iVar24;
  int new;
  int local_3c;
  SAM_hdr_tag *local_38;
  
  sVar9 = (size_t)(uint)len;
  if (len == 0) {
    sVar9 = strlen(lines);
  }
  sVar2 = (sh->text).l;
  iVar23 = (int)sVar9;
  __n = (size_t)iVar23;
  uVar10 = __n + sVar2 + 1;
  if (uVar10 < (sh->text).m) {
    pcVar12 = (sh->text).s;
    sVar11 = sVar2;
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    __size = (uVar10 >> 0x10 | uVar10) + 1;
    (sh->text).m = __size;
    pcVar12 = (char *)realloc((sh->text).s,__size);
    if (pcVar12 == (char *)0x0) {
      return -1;
    }
    (sh->text).s = pcVar12;
    sVar11 = (sh->text).l;
  }
  memcpy(pcVar12 + sVar11,lines,__n);
  sVar11 = (sh->text).l + __n;
  (sh->text).l = sVar11;
  (sh->text).s[sVar11] = '\0';
  iVar8 = -1;
  if (iVar23 != -1) {
    if (0 < iVar23) {
      pcVar12 = (sh->text).s + (int)sVar2;
      iVar8 = 0;
      do {
        lVar19 = (long)iVar8;
        pcVar16 = pcVar12 + lVar19;
        iVar7 = iVar8;
        if (pcVar12[lVar19] != '@') {
          pcVar12 = "Header line does not start with \'@\'";
          goto LAB_001374fd;
        }
        cVar5 = pcVar16[1];
        if ((byte)(cVar5 + 0x85U) < 0xc6) {
LAB_001374ec:
          pcVar12 = "Header line does not have a two character key";
LAB_001374fd:
          sam_hdr_error(pcVar12,pcVar16,iVar23 - iVar8,iVar7);
          return -1;
        }
        cVar1 = pcVar16[2];
        if ((byte)(cVar1 + 0x85U) < 0xc6) goto LAB_001374ec;
        uVar10 = lVar19 + 3;
        if (pcVar12[lVar19 + 3] != '\n') {
          h_type = (SAM_hdr_type *)pool_alloc(sh->type_pool);
          if (h_type == (SAM_hdr_type *)0x0) {
            return -1;
          }
          key = (int)cVar5 << 8 | (int)cVar1;
          kVar6 = kh_put_sam_hdr(sh->h,key,&local_3c);
          if (kVar6 == 0xffffffff) {
            return -1;
          }
          ppSVar3 = sh->h->vals;
          if (local_3c == 0) {
            pSVar13 = ppSVar3[kVar6];
            pSVar4 = pSVar13->prev;
            pSVar4->next = h_type;
            h_type->prev = pSVar4;
            pSVar13->prev = h_type;
            pcVar17 = (char *)(ulong)(pSVar4->order + 1);
          }
          else {
            ppSVar3[kVar6] = h_type;
            h_type->prev = h_type;
            pcVar17 = (char *)0x0;
            pSVar13 = h_type;
          }
          h_type->next = pSVar13;
          h_type->order = (int)pcVar17;
          if (cVar1 == 'O' && cVar5 == 'C') {
            if (pcVar12[uVar10] != '\t') {
              pcVar12 = "Missing tab";
              iVar7 = (int)pcVar17;
              goto LAB_001374fd;
            }
            uVar20 = lVar19 + 4;
            iVar8 = (int)uVar20;
            uVar10 = uVar20 & 0xffffffff;
            if (iVar8 < iVar23) {
              lVar19 = 0;
              do {
                if (pcVar12[lVar19 + uVar20] == '\n') {
                  uVar10 = (ulong)(uint)((int)lVar19 + iVar8);
                  goto LAB_0013742d;
                }
                lVar19 = lVar19 + 1;
              } while (__n - uVar20 != lVar19);
              uVar10 = sVar9 & 0xffffffff;
            }
LAB_0013742d:
            pSVar15 = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
            h_type->tag = pSVar15;
            if (pSVar15 == (SAM_hdr_tag *)0x0) {
              return -1;
            }
            iVar7 = (int)uVar10 - iVar8;
            pcVar16 = string_ndup(sh->str_pool,pcVar12 + iVar8,(long)iVar7);
            pSVar15->str = pcVar16;
            pSVar15->len = iVar7;
            pSVar15->next = (SAM_hdr_tag_s *)0x0;
            if (pcVar16 == (char *)0x0) {
              return -1;
            }
          }
          else {
            local_38 = (SAM_hdr_tag *)&h_type->tag;
            cVar5 = pcVar12[uVar10];
            pSVar15 = (SAM_hdr_tag *)0x0;
            do {
              iVar7 = (int)pcVar17;
              if (cVar5 != '\t') {
                pcVar12 = "Missing tab";
                goto LAB_001374fd;
              }
              uVar20 = (long)(int)uVar10 + 1;
              iVar18 = (int)uVar20;
              uVar10 = uVar20 & 0xffffffff;
              if (iVar18 < iVar23) {
                pcVar17 = (char *)(__n - uVar20);
                pcVar22 = (char *)0x0;
                do {
                  if ((byte)((pcVar12 + uVar20)[(long)pcVar22] - 9U) < 2) {
                    uVar10 = (ulong)(uint)((int)pcVar22 + iVar18);
                    goto LAB_00137396;
                  }
                  pcVar22 = pcVar22 + 1;
                } while (pcVar17 != pcVar22);
                uVar10 = sVar9 & 0xffffffff;
              }
LAB_00137396:
              iVar7 = (int)pcVar17;
              pSVar14 = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
              if (pSVar14 == (SAM_hdr_tag *)0x0) {
                return -1;
              }
              iVar21 = (int)uVar10;
              iVar24 = iVar21 - iVar18;
              pcVar17 = string_ndup(sh->str_pool,pcVar12 + iVar18,(long)iVar24);
              pSVar14->str = pcVar17;
              pSVar14->len = iVar24;
              pSVar14->next = (SAM_hdr_tag_s *)0x0;
              if (pcVar17 == (char *)0x0) {
                return -1;
              }
              if (iVar24 < 3) {
                pcVar12 = "Malformed key:value pair";
                goto LAB_001374fd;
              }
              if (pcVar17[2] != ':') {
                pcVar12 = "Malformed key:value pair";
                goto LAB_001374fd;
              }
              if (pSVar15 == (SAM_hdr_tag *)0x0) {
                pSVar15 = local_38;
              }
              pSVar15->next = pSVar14;
            } while ((iVar21 < iVar23) &&
                    (cVar5 = pcVar12[iVar21], pcVar17 = pcVar12, pSVar15 = pSVar14, cVar5 != '\n'));
          }
          iVar8 = sam_hdr_update_hashes(sh,key,h_type);
          if (iVar8 == -1) {
            return -1;
          }
        }
        iVar8 = (int)uVar10 + 1;
      } while (iVar8 < iVar23);
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int sam_hdr_add_lines(SAM_hdr *sh, const char *lines, int len) {
    int i, lno = 1, text_offset;
    char *hdr;

    if (!len)
	len = strlen(lines);

    text_offset = ks_len(&sh->text);
    if (EOF == kputsn(lines, len, &sh->text))
	return -1;
    hdr = ks_str(&sh->text) + text_offset;

    for (i = 0; i < len; i++) {
	khint32_t type;
	khint_t k;

	int l_start = i, new;
	SAM_hdr_type *h_type;
	SAM_hdr_tag *h_tag, *last;

	if (hdr[i] != '@') {
	    int j;
	    for (j = i; j < len && hdr[j] != '\n'; j++)
		;
	    sam_hdr_error("Header line does not start with '@'",
			  &hdr[l_start], len - l_start, lno);
	    return -1;
	}

	type = (hdr[i+1]<<8) | hdr[i+2];
	if (hdr[i+1] < 'A' || hdr[i+1] > 'z' ||
	    hdr[i+2] < 'A' || hdr[i+2] > 'z') {
	    sam_hdr_error("Header line does not have a two character key",
			  &hdr[l_start], len - l_start, lno);
	    return -1;
	}

	i += 3;
	if (hdr[i] == '\n')
	    continue;

	// Add the header line type
	if (!(h_type = pool_alloc(sh->type_pool)))
	    return -1;
	if (-1 == (k = kh_put(sam_hdr, sh->h, type, &new)))
	    return -1;

	// Form the ring, either with self or other lines of this type
	if (!new) {
	    SAM_hdr_type *t = kh_val(sh->h, k), *p;
	    p = t->prev;
	    
	    assert(p->next = t);
	    p->next = h_type;
	    h_type->prev = p;

	    t->prev = h_type;
	    h_type->next = t;
	    h_type->order = p->order+1;
	} else {
	    kh_val(sh->h, k) = h_type;
	    h_type->prev = h_type->next = h_type;
	    h_type->order = 0;
	}

	// Parse the tags on this line
	last = NULL;
	if ((type>>8) == 'C' && (type&0xff) == 'O') {
	    int j;
	    if (hdr[i] != '\t') {
		sam_hdr_error("Missing tab",
			      &hdr[l_start], len - l_start, lno);
		return -1;
	    }

	    for (j = ++i; j < len && hdr[j] != '\n'; j++)
		;

	    if (!(h_type->tag = h_tag = pool_alloc(sh->tag_pool)))
		return -1;
	    h_tag->str = string_ndup(sh->str_pool, &hdr[i], j-i);
	    h_tag->len = j-i;
	    h_tag->next = NULL;
	    if (!h_tag->str)
		return -1;

	    i = j;

	} else {
	    do {
		int j;
		if (hdr[i] != '\t') {
		    sam_hdr_error("Missing tab",
				  &hdr[l_start], len - l_start, lno);
		    return -1;
		}

		for (j = ++i; j < len && hdr[j] != '\n' && hdr[j] != '\t'; j++)
		    ;
	    
		if (!(h_tag = pool_alloc(sh->tag_pool)))
		    return -1;
		h_tag->str = string_ndup(sh->str_pool, &hdr[i], j-i);
		h_tag->len = j-i;
		h_tag->next = NULL;
		if (!h_tag->str)
		    return -1;

		if (h_tag->len < 3 || h_tag->str[2] != ':') {
		    sam_hdr_error("Malformed key:value pair",
				  &hdr[l_start], len - l_start, lno);
		    return -1;
		}
	    
		if (last)
		    last->next = h_tag;
		else
		    h_type->tag = h_tag;

		last = h_tag;
		i = j;
	    } while (i < len && hdr[i] != '\n');
	}

	/* Update RG/SQ hashes */
	if (-1 == sam_hdr_update_hashes(sh, type, h_type))
	    return -1;
    }

    return 0;
}